

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_SGIX_fragment_lighting(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_SGIX_fragment_lighting != 0) {
    glad_glFragmentColorMaterialSGIX =
         (PFNGLFRAGMENTCOLORMATERIALSGIXPROC)(*load)("glFragmentColorMaterialSGIX");
    glad_glFragmentLightfSGIX = (PFNGLFRAGMENTLIGHTFSGIXPROC)(*load)("glFragmentLightfSGIX");
    glad_glFragmentLightfvSGIX = (PFNGLFRAGMENTLIGHTFVSGIXPROC)(*load)("glFragmentLightfvSGIX");
    glad_glFragmentLightiSGIX = (PFNGLFRAGMENTLIGHTISGIXPROC)(*load)("glFragmentLightiSGIX");
    glad_glFragmentLightivSGIX = (PFNGLFRAGMENTLIGHTIVSGIXPROC)(*load)("glFragmentLightivSGIX");
    glad_glFragmentLightModelfSGIX =
         (PFNGLFRAGMENTLIGHTMODELFSGIXPROC)(*load)("glFragmentLightModelfSGIX");
    glad_glFragmentLightModelfvSGIX =
         (PFNGLFRAGMENTLIGHTMODELFVSGIXPROC)(*load)("glFragmentLightModelfvSGIX");
    glad_glFragmentLightModeliSGIX =
         (PFNGLFRAGMENTLIGHTMODELISGIXPROC)(*load)("glFragmentLightModeliSGIX");
    glad_glFragmentLightModelivSGIX =
         (PFNGLFRAGMENTLIGHTMODELIVSGIXPROC)(*load)("glFragmentLightModelivSGIX");
    glad_glFragmentMaterialfSGIX =
         (PFNGLFRAGMENTMATERIALFSGIXPROC)(*load)("glFragmentMaterialfSGIX");
    glad_glFragmentMaterialfvSGIX =
         (PFNGLFRAGMENTMATERIALFVSGIXPROC)(*load)("glFragmentMaterialfvSGIX");
    glad_glFragmentMaterialiSGIX =
         (PFNGLFRAGMENTMATERIALISGIXPROC)(*load)("glFragmentMaterialiSGIX");
    glad_glFragmentMaterialivSGIX =
         (PFNGLFRAGMENTMATERIALIVSGIXPROC)(*load)("glFragmentMaterialivSGIX");
    glad_glGetFragmentLightfvSGIX =
         (PFNGLGETFRAGMENTLIGHTFVSGIXPROC)(*load)("glGetFragmentLightfvSGIX");
    glad_glGetFragmentLightivSGIX =
         (PFNGLGETFRAGMENTLIGHTIVSGIXPROC)(*load)("glGetFragmentLightivSGIX");
    glad_glGetFragmentMaterialfvSGIX =
         (PFNGLGETFRAGMENTMATERIALFVSGIXPROC)(*load)("glGetFragmentMaterialfvSGIX");
    glad_glGetFragmentMaterialivSGIX =
         (PFNGLGETFRAGMENTMATERIALIVSGIXPROC)(*load)("glGetFragmentMaterialivSGIX");
    glad_glLightEnviSGIX = (PFNGLLIGHTENVISGIXPROC)(*load)("glLightEnviSGIX");
  }
  return;
}

Assistant:

static void load_GL_SGIX_fragment_lighting(GLADloadproc load) {
	if(!GLAD_GL_SGIX_fragment_lighting) return;
	glad_glFragmentColorMaterialSGIX = (PFNGLFRAGMENTCOLORMATERIALSGIXPROC)load("glFragmentColorMaterialSGIX");
	glad_glFragmentLightfSGIX = (PFNGLFRAGMENTLIGHTFSGIXPROC)load("glFragmentLightfSGIX");
	glad_glFragmentLightfvSGIX = (PFNGLFRAGMENTLIGHTFVSGIXPROC)load("glFragmentLightfvSGIX");
	glad_glFragmentLightiSGIX = (PFNGLFRAGMENTLIGHTISGIXPROC)load("glFragmentLightiSGIX");
	glad_glFragmentLightivSGIX = (PFNGLFRAGMENTLIGHTIVSGIXPROC)load("glFragmentLightivSGIX");
	glad_glFragmentLightModelfSGIX = (PFNGLFRAGMENTLIGHTMODELFSGIXPROC)load("glFragmentLightModelfSGIX");
	glad_glFragmentLightModelfvSGIX = (PFNGLFRAGMENTLIGHTMODELFVSGIXPROC)load("glFragmentLightModelfvSGIX");
	glad_glFragmentLightModeliSGIX = (PFNGLFRAGMENTLIGHTMODELISGIXPROC)load("glFragmentLightModeliSGIX");
	glad_glFragmentLightModelivSGIX = (PFNGLFRAGMENTLIGHTMODELIVSGIXPROC)load("glFragmentLightModelivSGIX");
	glad_glFragmentMaterialfSGIX = (PFNGLFRAGMENTMATERIALFSGIXPROC)load("glFragmentMaterialfSGIX");
	glad_glFragmentMaterialfvSGIX = (PFNGLFRAGMENTMATERIALFVSGIXPROC)load("glFragmentMaterialfvSGIX");
	glad_glFragmentMaterialiSGIX = (PFNGLFRAGMENTMATERIALISGIXPROC)load("glFragmentMaterialiSGIX");
	glad_glFragmentMaterialivSGIX = (PFNGLFRAGMENTMATERIALIVSGIXPROC)load("glFragmentMaterialivSGIX");
	glad_glGetFragmentLightfvSGIX = (PFNGLGETFRAGMENTLIGHTFVSGIXPROC)load("glGetFragmentLightfvSGIX");
	glad_glGetFragmentLightivSGIX = (PFNGLGETFRAGMENTLIGHTIVSGIXPROC)load("glGetFragmentLightivSGIX");
	glad_glGetFragmentMaterialfvSGIX = (PFNGLGETFRAGMENTMATERIALFVSGIXPROC)load("glGetFragmentMaterialfvSGIX");
	glad_glGetFragmentMaterialivSGIX = (PFNGLGETFRAGMENTMATERIALIVSGIXPROC)load("glGetFragmentMaterialivSGIX");
	glad_glLightEnviSGIX = (PFNGLLIGHTENVISGIXPROC)load("glLightEnviSGIX");
}